

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O1

void __thiscall
soul::SanityCheckPass::PostResolutionChecks::visit(PostResolutionChecks *this,Annotation *a)

{
  pointer pPVar1;
  vector<soul::AST::Annotation::Property,_std::allocator<soul::AST::Annotation::Property>_>
  *__range2;
  Property *property_1;
  pointer pPVar2;
  Property *property;
  
  pPVar1 = (a->properties).
           super__Vector_base<soul::AST::Annotation::Property,_std::allocator<soul::AST::Annotation::Property>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pPVar2 = (a->properties).
                super__Vector_base<soul::AST::Annotation::Property,_std::allocator<soul::AST::Annotation::Property>_>
                ._M_impl.super__Vector_impl_data._M_start; pPVar2 != pPVar1; pPVar2 = pPVar2 + 1) {
    (*(this->super_ASTVisitor)._vptr_ASTVisitor[3])(this,(pPVar2->value).object);
  }
  pPVar1 = (a->properties).
           super__Vector_base<soul::AST::Annotation::Property,_std::allocator<soul::AST::Annotation::Property>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pPVar2 = (a->properties).
                super__Vector_base<soul::AST::Annotation::Property,_std::allocator<soul::AST::Annotation::Property>_>
                ._M_impl.super__Vector_impl_data._M_start; pPVar2 != pPVar1; pPVar2 = pPVar2 + 1) {
    checkPropertyValue((pPVar2->value).object);
  }
  return;
}

Assistant:

void visit (AST::Annotation& a) override
        {
            super::visit (a);

            for (auto& property : a.properties)
                checkPropertyValue (property.value);
        }